

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O0

int __thiscall FShaderManager::Find(FShaderManager *this,char *shn)

{
  bool bVar1;
  uint uVar2;
  FShader **ppFVar3;
  uint local_28;
  FName local_24;
  uint i;
  FName sfn;
  char *shn_local;
  FShaderManager *this_local;
  
  _i = shn;
  FName::FName(&local_24,shn);
  local_28 = 0;
  while( true ) {
    uVar2 = TArray<FShader_*,_FShader_*>::Size(&this->mTextureEffects);
    if (uVar2 <= local_28) {
      return -1;
    }
    ppFVar3 = TArray<FShader_*,_FShader_*>::operator[](&this->mTextureEffects,(ulong)local_28);
    bVar1 = FName::operator==(&(*ppFVar3)->mName,&local_24);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

int FShaderManager::Find(const char * shn)
{
	FName sfn = shn;

	for(unsigned int i=0;i<mTextureEffects.Size();i++)
	{
		if (mTextureEffects[i]->mName == sfn)
		{
			return i;
		}
	}
	return -1;
}